

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCCof.c
# Opt level: O1

void Gia_ManCofExtendSolver(Ccf_Man_t *p)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  uint uVar5;
  Gia_Man_t *pGVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  int local_58;
  uint local_54;
  uint local_50;
  int local_4c;
  sat_solver *local_48;
  undefined8 local_40;
  Ccf_Man_t *local_38;
  undefined8 uVar4;
  
  uVar2 = sat_solver_nvars(p->pSat);
  uVar4 = CONCAT44(extraout_var,uVar2);
  pGVar6 = p->pFrames;
  iVar3 = pGVar6->nObjs;
  if ((int)uVar2 < iVar3) {
    lVar7 = (ulong)uVar2 * 0xc;
    iVar9 = uVar2 * 2;
    local_40 = uVar4;
    local_38 = p;
    do {
      if ((int)uVar4 < 0) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar1 = *(ulong *)(&pGVar6->pObjs->field_0x0 + lVar7);
      uVar8 = (uint)uVar1;
      if ((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) {
        local_48 = p->pSat;
        local_58 = iVar9 + 1;
        uVar8 = ((uint)(uVar1 >> 0x1d) & 1) + (uVar8 & 0x1fffffff) * -2 + iVar9;
        local_54 = uVar8;
        local_4c = local_58;
        iVar3 = sat_solver_addclause(local_48,&local_58,(lit *)&local_50);
        if (iVar3 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                        ,0x196,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)")
          ;
        }
        uVar5 = (uint)(uVar1 >> 0x20);
        local_58 = local_4c;
        uVar5 = (uVar5 >> 0x1d & 1) + (uVar5 & 0x1fffffff) * -2 + iVar9;
        local_54 = uVar5;
        iVar3 = sat_solver_addclause(local_48,&local_58,(lit *)&local_50);
        if (iVar3 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                        ,0x19b,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)")
          ;
        }
        local_54 = uVar8 ^ 1;
        local_50 = uVar5 ^ 1;
        local_58 = iVar9;
        iVar3 = sat_solver_addclause(local_48,&local_58,&local_4c);
        uVar4 = local_40;
        p = local_38;
        if (iVar3 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                        ,0x1a1,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)")
          ;
        }
      }
      pGVar6 = p->pFrames;
      iVar3 = pGVar6->nObjs;
      lVar7 = lVar7 + 0xc;
      iVar9 = iVar9 + 2;
      uVar2 = uVar2 + 1;
    } while ((int)uVar2 < iVar3);
  }
  sat_solver_setnvars(p->pSat,iVar3);
  return;
}

Assistant:

void Gia_ManCofExtendSolver( Ccf_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    // add SAT clauses
    for ( i = sat_solver_nvars(p->pSat); i < Gia_ManObjNum(p->pFrames); i++ )
    {
        pObj = Gia_ManObj( p->pFrames, i );
        if ( Gia_ObjIsAnd(pObj) )
            sat_solver_add_and( p->pSat, i, 
                Gia_ObjFaninId0(pObj, i), 
                Gia_ObjFaninId1(pObj, i), 
                Gia_ObjFaninC0(pObj), 
                Gia_ObjFaninC1(pObj), 0 ); 
    }
    sat_solver_setnvars( p->pSat, Gia_ManObjNum(p->pFrames) );
}